

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtObj.c
# Opt level: O0

newtRef NewtMakeString2(char *s,uint32_t len,_Bool literal)

{
  _Bool _Var1;
  newtRef v;
  char *pcVar2;
  char *objData;
  newtRefVar r;
  _Bool literal_local;
  uint32_t len_local;
  char *s_local;
  
  v = NewtMakeBinary(newt_sym.string,(uint8_t *)s,len + 1,literal);
  _Var1 = NewtRefIsNotNIL(v);
  if (_Var1) {
    pcVar2 = NewtRefToString(v);
    if ((s == (char *)0x0) || (len == 0)) {
      *pcVar2 = '\0';
    }
    else {
      pcVar2[len] = '\0';
    }
  }
  return v;
}

Assistant:

newtRef NewtMakeString2(const char *s, uint32_t len, bool literal)
{
    newtRefVar  r;
    
    r = NewtMakeBinary(NSSYM0(string), (uint8_t *)s, len + 1, literal); 
    
    if (NewtRefIsNotNIL(r))
    {
        char *	objData;
        
        objData = NewtRefToString(r);
        
        if (s != NULL && 0 < len)
        {
            //			strncpy(objData, s, len);
            objData[len] = '\0';
        }
        else
        {
            objData[0] = '\0';
        }
    }
    
    return r;
}